

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

dsListEntry * dsListNext(dsListEntry *entry)

{
  dsListEntry *pdVar1;
  
  if (entry->nextOffset == 0xffffffffffffffff) {
    pdVar1 = (dsListEntry *)0x0;
  }
  else {
    dsRunLogCallback("%s(): next: %lu\n","dsListNext");
    pdVar1 = (dsListEntry *)dsPtr(entry->nextOffset,0x20);
    if (pdVar1 == (dsListEntry *)0x0) {
      pdVar1 = (dsListEntry *)0x0;
      dsRunLogCallback("%s(): Can\'t map next list entry.\n","dsListNext");
    }
  }
  return pdVar1;
}

Assistant:

dsListEntry *
dsListNext(dsListEntry *entry)
{
	if (entry->nextOffset == UINT64_MAX) {
		return(NULL);
	}

	dsLog("next: %" PRIu64 "\n", entry->nextOffset);

	if ((entry = dsPtr(entry->nextOffset, sizeof(*entry))) == NULL) {
		dsLog("Can't map next list entry.\n");
		return(NULL);
	}

	return(entry);
}